

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

void __thiscall Scene::create_descriptors(Scene *this,shared_ptr<myvk::Device> *device)

{
  pointer pTVar1;
  pointer pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [8];
  element_type *peVar7;
  uint uVar8;
  shared_ptr<myvk::ImageView> *psVar9;
  VkDescriptorType VVar10;
  ulong uVar11;
  long lVar12;
  VkSampler **pppVVar13;
  uint uVar14;
  size_type __n;
  initializer_list<VkDescriptorSetLayoutBinding> __l;
  initializer_list<VkDescriptorPoolSize> __l_00;
  vector<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_> image_infos;
  vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_> immutable_samplers;
  allocator_type local_b9;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [24];
  VkDescriptorSetLayout pVStack_70;
  int local_68;
  undefined4 uStack_64;
  pointer pVStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [8];
  undefined8 uStack_40;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pTVar1 = (this->m_textures).super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pTVar2 = (this->m_textures).super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __n = (long)pTVar1 - (long)pTVar2 >> 5;
  uVar8 = (uint)__n;
  uVar14 = 1;
  if (1 < uVar8) {
    uVar14 = uVar8;
  }
  if (pTVar1 == pTVar2) {
    local_98._0_8_ = local_b8;
    local_b8._0_8_ = (element_type *)0x100000000;
    local_b8._12_4_ = 0x10;
    local_b8._8_4_ = uVar14;
    local_b8._16_8_ = (pointer)0x0;
    local_b8._24_4_ = 4;
    local_98._8_8_ = (element_type *)0x1;
    myvk::DescriptorBindingFlagGroup::DescriptorBindingFlagGroup
              ((DescriptorBindingFlagGroup *)(local_98 + 0x10),
               (initializer_list<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_> *)local_98)
    ;
    myvk::DescriptorSetLayout::Create
              ((DescriptorSetLayout *)local_48,device,
               (DescriptorBindingFlagGroup *)(local_98 + 0x10));
    peVar7 = uStack_40;
    auVar6 = local_48;
    local_48._0_4_ = VK_DESCRIPTOR_TYPE_SAMPLER;
    local_48._4_4_ = 0;
    uStack_40 = (element_type *)0x0;
    p_Var3 = (this->m_descriptor_set_layout).
             super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->m_descriptor_set_layout).
    super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)auVar6;
    (this->m_descriptor_set_layout).
    super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (uStack_40 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_40);
    }
  }
  else {
    std::vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>::vector
              ((vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_> *)(local_98 + 0x10),__n,
               (allocator_type *)local_b8);
    if ((this->m_textures).super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (this->m_textures).super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar8 = 1;
      uVar11 = 0;
      do {
        (&(((DeviceObjectBase *)local_88._0_8_)->super_Base)._vptr_Base)[uVar11] =
             (_func_int **)
             ((this->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->m_sampler;
        uVar11 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
      } while (uVar11 < (ulong)((long)(this->m_textures).
                                      super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_textures).
                                      super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    local_48._0_4_ = VK_DESCRIPTOR_TYPE_SAMPLER;
    local_48._4_4_ = 1;
    uStack_40 = (element_type *)CONCAT44(0x10,uVar14);
    local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._0_8_;
    __l._M_len = 1;
    __l._M_array = (iterator)local_48;
    std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::vector
              ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                *)local_b8,__l,&local_b9);
    myvk::DescriptorSetLayout::Create
              ((DescriptorSetLayout *)local_98,device,
               (vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                *)local_b8);
    uVar5 = local_98._8_8_;
    uVar4 = local_98._0_8_;
    local_98._0_8_ = (iterator)0x0;
    local_98._8_8_ = (element_type *)0x0;
    p_Var3 = (this->m_descriptor_set_layout).
             super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->m_descriptor_set_layout).
    super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar4;
    (this->m_descriptor_set_layout).
    super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    pVStack_70 = (VkDescriptorSetLayout)local_b8._0_8_;
    pVStack_60 = (pointer)local_b8._16_8_;
    if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
      pVStack_70 = (VkDescriptorSetLayout)local_b8._0_8_;
      pVStack_60 = (pointer)local_b8._16_8_;
    }
  }
  if ((element_type *)pVStack_70 != (element_type *)0x0) {
    operator_delete(pVStack_70,(long)pVStack_60 - (long)pVStack_70);
  }
  if ((element_type *)local_88._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
  }
  VVar10 = (VkDescriptorType)
           ((ulong)((long)(this->m_textures).
                          super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_textures).
                         super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>._M_impl
                         .super__Vector_impl_data._M_start) >> 5);
  local_48._4_4_ = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  if (VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER < VVar10) {
    local_48._4_4_ = VVar10;
  }
  local_48._0_4_ = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_48;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            ((vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)
             (local_98 + 0x10),__l_00,(allocator_type *)local_98);
  myvk::DescriptorPool::Create
            ((DescriptorPool *)local_b8,device,1,
             (vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)
             (local_98 + 0x10));
  uVar5 = local_b8._8_8_;
  uVar4 = local_b8._0_8_;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (pointer)0x0;
  p_Var3 = (this->m_descriptor_pool).
           super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_descriptor_pool).super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar4;
  (this->m_descriptor_pool).super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
  }
  if ((element_type *)local_88._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
  }
  myvk::DescriptorSet::Create
            ((DescriptorSet *)(local_98 + 0x10),&this->m_descriptor_pool,
             &this->m_descriptor_set_layout);
  uVar5 = local_88._8_8_;
  uVar4 = local_88._0_8_;
  local_88._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88._8_8_ = (element_type *)0x0;
  p_Var3 = (this->m_descriptor_set).
           super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_descriptor_set).super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar4;
  (this->m_descriptor_set).super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  pTVar1 = (this->m_textures).super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (this->m_textures).super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar1 != pTVar2) {
    std::vector<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_>::vector
              ((vector<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_> *)local_b8,
               (long)pTVar2 - (long)pTVar1 >> 5,(allocator_type *)(local_98 + 0x10));
    pTVar1 = (this->m_textures).super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar12 = (long)(this->m_textures).
                   super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pTVar1;
    if (lVar12 != 0) {
      pppVVar13 = (VkSampler **)(local_b8._0_8_ + 0x10);
      psVar9 = &pTVar1->m_image_view;
      uVar14 = 1;
      do {
        *(undefined4 *)pppVVar13 = 5;
        pppVVar13[-1] =
             (VkSampler *)
             ((psVar9->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             m_image_view;
        uVar11 = (ulong)uVar14;
        pppVVar13 = pppVVar13 + 3;
        psVar9 = psVar9 + 2;
        uVar14 = uVar14 + 1;
      } while (uVar11 < (ulong)(lVar12 >> 5));
    }
    local_88._8_8_ = (element_type *)0x0;
    local_58 = 0;
    uStack_50 = 0;
    local_88._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x23;
    local_88._16_8_ =
         ((this->m_descriptor_set).
          super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         m_descriptor_set;
    pVStack_70 = (VkDescriptorSetLayout)0x0;
    _local_68 = CONCAT44(1,(int)((ulong)(local_b8._8_8_ - local_b8._0_8_) >> 3) * -0x55555555);
    pVStack_60 = (pointer)local_b8._0_8_;
    (*vkUpdateDescriptorSets)
              (((device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               m_device,1,(VkWriteDescriptorSet *)(local_98 + 0x10),0,(VkCopyDescriptorSet *)0x0);
    if ((pointer)local_b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
    }
  }
  return;
}

Assistant:

void Scene::create_descriptors(const std::shared_ptr<myvk::Device> &device) {
	{
		VkDescriptorSetLayoutBinding layout_binding = {};
		layout_binding.binding = 0;
		layout_binding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
		layout_binding.descriptorCount = std::max((uint32_t)m_textures.size(), 1u);
		layout_binding.stageFlags = VK_SHADER_STAGE_FRAGMENT_BIT;

		if (!m_textures.empty()) {
			std::vector<VkSampler> immutable_samplers(m_textures.size());
			for (uint32_t i = 0; i < m_textures.size(); ++i)
				immutable_samplers[i] = m_sampler->GetHandle();
			layout_binding.pImmutableSamplers = immutable_samplers.data();
			m_descriptor_set_layout = myvk::DescriptorSetLayout::Create(device, {layout_binding});
		} else {
			m_descriptor_set_layout = myvk::DescriptorSetLayout::Create(
			    device, {{layout_binding, VK_DESCRIPTOR_BINDING_PARTIALLY_BOUND_BIT}});
		}
	}
	m_descriptor_pool = myvk::DescriptorPool::Create(
	    device, 1, {{VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, std::max((uint32_t)m_textures.size(), 1u)}});
	m_descriptor_set = myvk::DescriptorSet::Create(m_descriptor_pool, m_descriptor_set_layout);

	if (!m_textures.empty()) {
		std::vector<VkDescriptorImageInfo> image_infos(m_textures.size());
		for (uint32_t i = 0; i < m_textures.size(); ++i) {
			image_infos[i].imageLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
			image_infos[i].imageView = m_textures[i].m_image_view->GetHandle();
			// image_infos[i].sampler = m_sampler->GetHandle(); // No need for immutable samplers
		}

		VkWriteDescriptorSet write = {};
		write.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
		write.dstSet = m_descriptor_set->GetHandle();
		write.dstBinding = 0;
		write.dstArrayElement = 0;
		write.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
		write.descriptorCount = image_infos.size();
		write.pImageInfo = image_infos.data();

		vkUpdateDescriptorSets(device->GetHandle(), 1, &write, 0, nullptr);
	}
}